

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::create_dir(filename_t *path)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  filename_t *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  size_type token_pos;
  size_t search_offset;
  string local_40 [32];
  size_type local_20;
  ulong local_18;
  byte local_1;
  
  bVar2 = path_exists(in_stack_00000020);
  if (bVar2) {
    local_1 = 1;
  }
  else {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20f4ad
                      );
    if (bVar2) {
      local_1 = 0;
    }
    else {
      local_18 = 0;
      do {
        local_20 = std::__cxx11::string::find((char)in_RDI,0x2f);
        if (local_20 == 0xffffffffffffffff) {
          local_20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::size(in_RDI);
        }
        std::__cxx11::string::substr((ulong)local_40,(ulong)in_RDI);
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20f518)
        ;
        if (((bVar2) || (bVar2 = path_exists(in_stack_00000020), bVar2)) ||
           (bVar2 = mkdir_((filename_t *)0x20f534), bVar2)) {
          local_18 = local_20 + 1;
          bVar2 = false;
        }
        else {
          local_1 = 0;
          bVar2 = true;
        }
        std::__cxx11::string::~string(local_40);
        uVar1 = local_18;
        if (bVar2) goto LAB_0020f5c3;
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(in_RDI);
      } while (uVar1 < sVar3);
      local_1 = 1;
    }
  }
LAB_0020f5c3:
  return (bool)(local_1 & 1);
}

Assistant:

SPDLOG_INLINE bool create_dir(filename_t path)
{
    if (path_exists(path))
    {
        return true;
    }

    if (path.empty())
    {
        return false;
    }

#ifdef _WIN32
    // support forward slash in windows
    std::replace(path.begin(), path.end(), '/', folder_sep);
#endif

    size_t search_offset = 0;
    do
    {
        auto token_pos = path.find(folder_sep, search_offset);
        // treat the entire path as a folder if no folder separator not found
        if (token_pos == filename_t::npos)
        {
            token_pos = path.size();
        }

        auto subdir = path.substr(0, token_pos);

        if (!subdir.empty() && !path_exists(subdir) && !mkdir_(subdir))
        {
            return false; // return error if failed creating dir
        }
        search_offset = token_pos + 1;
    } while (search_offset < path.size());

    return true;
}